

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O1

_Bool HMAC_Validate(COSE_MacMessage *pcose,int HSize,int TSize,byte *pbKey,size_t cbKey,
                   byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  byte bVar1;
  int iVar2;
  cose_error cVar3;
  mbedtls_md_info_t *md_info;
  uchar *output;
  cn_cbor *pcVar4;
  ulong uVar5;
  _Bool _Var6;
  char *md_name;
  mbedtls_md_context_t local_48;
  
  if (HSize == 0x100) {
    md_name = "SHA256";
LAB_0019bd85:
    mbedtls_md_init(&local_48);
    md_info = mbedtls_md_info_from_string(md_name);
    mbedtls_md_setup(&local_48,md_info,1);
    bVar1 = mbedtls_md_get_size(md_info);
    output = (uchar *)calloc((ulong)bVar1,1);
    if (output == (uchar *)0x0) {
      cVar3 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_0019be1b;
    }
    iVar2 = mbedtls_md_hmac_starts(&local_48,pbKey,cbKey);
    if (((iVar2 == 0) &&
        (iVar2 = mbedtls_md_hmac_update(&local_48,pbAuthData,cbAuthData), iVar2 == 0)) &&
       (iVar2 = mbedtls_md_hmac_finish(&local_48,output), iVar2 == 0)) {
      pcVar4 = _COSE_arrayget_int(&pcose->m_message,3);
      if (pcVar4 != (cn_cbor *)0x0) {
        if ((int)(uint)bVar1 < pcVar4->length) {
          return false;
        }
        _Var6 = true;
        if (7 < (uint)TSize) {
          uVar5 = 0;
          bVar1 = 0;
          do {
            bVar1 = bVar1 | (pcVar4->v).bytes[uVar5] != output[uVar5];
            uVar5 = uVar5 + 1;
          } while ((uint)TSize >> 3 != uVar5);
          _Var6 = (_Bool)(bVar1 ^ 1);
        }
        goto LAB_0019be30;
      }
      cVar3 = COSE_ERR_CBOR;
    }
    else {
      cVar3 = COSE_ERR_CRYPTO_FAIL;
    }
  }
  else {
    if (HSize == 0x200) {
      md_name = "SHA512";
      goto LAB_0019bd85;
    }
    if (HSize == 0x180) {
      md_name = "SHA384";
      goto LAB_0019bd85;
    }
    cVar3 = COSE_ERR_INVALID_PARAMETER;
LAB_0019be1b:
    output = (uchar *)0x0;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar3;
  }
  free(output);
  _Var6 = false;
LAB_0019be30:
  mbedtls_md_free(&local_48);
  return _Var6;
}

Assistant:

bool HMAC_Validate(COSE_MacMessage * pcose, int HSize, int TSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_md_context_t contx;
	const char* md_name;
	const struct mbedtls_md_info_t * info;
	byte * rgbOut = NULL;
	unsigned int cbOut;
	bool f = false;
	unsigned int i;

#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	switch (HSize) {
		case 256: md_name = "SHA256"; break;
		case 384: md_name = "SHA384"; break;
		case 512: md_name = "SHA512"; break;
		default: FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER); break;
	}

	mbedtls_md_init(&contx);
	info = mbedtls_md_info_from_string (md_name);
	mbedtls_md_setup( &contx, info, 1 );
	
	cbOut = mbedtls_md_get_size(info);
	rgbOut = COSE_CALLOC(cbOut, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!(mbedtls_md_hmac_starts (&contx, pbKey, cbKey)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_update (&contx, pbAuthData, cbAuthData)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_finish (&contx, rgbOut)), COSE_ERR_CRYPTO_FAIL);

	cn_cbor * cn = _COSE_arrayget_int(&pcose->m_message, INDEX_MAC_TAG);
	CHECK_CONDITION(cn != NULL, COSE_ERR_CBOR);

	if (cn->length > (int) cbOut) return false;
	for (i = 0; i < (unsigned int) TSize/8; i++) f |= (cn->v.bytes[i] != rgbOut[i]);

	mbedtls_md_free(&contx); 
	return !f;

errorReturn:
	COSE_FREE(rgbOut, context);
	mbedtls_md_free(&contx); 
	return false;
}